

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O3

void __thiscall Diligent::GLContextState::SetProgram(GLContextState *this,GLProgramObj *GLProgram)

{
  GLuint GVar1;
  int iVar2;
  GLenum err;
  string msg;
  uint local_3c;
  string local_38;
  
  GVar1 = GLProgram->m_uiHandle;
  if (GVar1 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = (GLProgram->m_UniqueId).m_ID;
    if (iVar2 == 0) {
      LOCK();
      UNLOCK();
      iVar2 = UniqueIdHelper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>::GetID()::
              GlobalCounter + 1;
      UniqueIdHelper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>::GetID()::GlobalCounter =
           UniqueIdHelper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>::GetID()::GlobalCounter
           + 1;
      (GLProgram->m_UniqueId).m_ID = iVar2;
    }
  }
  if (this->m_GLProgId != iVar2) {
    this->m_GLProgId = iVar2;
    (*__glewUseProgram)(GVar1);
    local_3c = glGetError();
    if (local_3c != 0) {
      LogError<false,char[25],char[17],unsigned_int>
                (false,"SetProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x95,(char (*) [25])"Failed to set GL program",(char (*) [17])"\nGL Error Code: ",
                 &local_3c);
      FormatString<char[6]>(&local_38,(char (*) [6])0x8506c9);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x95);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void GLContextState::SetProgram(const GLProgramObj& GLProgram)
{
    GLuint GLProgHandle = 0;
    if (UpdateBoundObject(m_GLProgId, GLProgram, GLProgHandle))
    {
        glUseProgram(GLProgHandle);
        DEV_CHECK_GL_ERROR("Failed to set GL program");
    }
}